

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DShadowTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DShadowTestInstance *this)

{
  ParameterType *pPVar1;
  int iVar2;
  deUint32 width;
  deUint32 height;
  TestContext *pTVar3;
  TestLog *pTVar4;
  reference pvVar5;
  TestTexture2D *pTVar6;
  undefined4 extraout_var;
  MessageBuilder *pMVar7;
  reference pvVar8;
  TextureFormat texFormat;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type sVar9;
  PixelFormat PVar10;
  allocator<char> local_979;
  string local_978;
  undefined4 local_958;
  allocator<char> local_951;
  string local_950;
  MessageBuilder local_930;
  ConstPixelBufferAccess local_7b0;
  undefined1 local_785;
  undefined1 auStack_784 [7];
  bool isOk;
  int local_77c;
  MessageBuilder local_778;
  ConstPixelBufferAccess local_5f8;
  undefined1 local_5c9;
  undefined1 auStack_5c8 [7];
  bool isHighQuality;
  int local_5c0;
  Vector<int,_3> local_5bc;
  undefined1 local_5b0 [8];
  TexComparePrecision texComparePrecision;
  LodPrecision lodPrecision;
  undefined1 local_578 [8];
  PixelFormat pixelFormat;
  MessageBuilder local_3e8;
  Sampler local_264;
  undefined1 local_228 [8];
  vector<float,_std::allocator<float>_> texCoord;
  Surface rendered;
  ReferenceParams sampleParams;
  FilterCase *curCase;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ScopedLogSection local_78;
  ScopedLogSection section;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  TestTexture2D *texture;
  TestLog *log;
  Texture2DShadowTestInstance *this_local;
  
  pTVar3 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  pvVar5 = std::
           vector<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
           ::operator[](&this->m_cases,(long)this->m_caseNdx);
  pTVar6 = util::TextureRenderer::get2DTexture(&this->m_renderer,pvVar5->textureIndex);
  iVar2 = (*(pTVar6->super_TestTexture)._vptr_TestTexture[0xe])();
  fmtInfo.lookupBias.m_data._8_8_ = *(undefined8 *)CONCAT44(extraout_var,iVar2);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&section,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Test",&local_b9);
  de::toString<int>(&local_f0,&this->m_caseNdx);
  std::operator+(&local_98,&local_b8,&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Test ",&local_131);
  de::toString<int>((string *)&curCase,&this->m_caseNdx);
  std::operator+(&local_110,&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&curCase);
  tcu::ScopedLogSection::ScopedLogSection(&local_78,pTVar4,&local_98,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&curCase);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  sampleParams._140_8_ =
       std::
       vector<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
       ::operator[](&this->m_cases,(long)this->m_caseNdx);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),TEXTURETYPE_2D);
  width = util::TextureRenderer::getRenderWidth(&this->m_renderer);
  height = util::TextureRenderer::getRenderHeight(&this->m_renderer);
  tcu::Surface::Surface
            ((Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,width,height);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_228);
  pPVar1 = this->m_testParameters;
  util::createSampler(&local_264,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapS,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapT,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.minFilter,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.magFilter);
  tcu::Sampler::operator=
            ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_264);
  sampleParams.sampler.lodThreshold =
       (float)(this->m_testParameters->super_TextureShadowCommonTestCaseParameters).compareOp;
  sampleParams.sampler.seamlessCubeMap = false;
  sampleParams.sampler._53_3_ = 0;
  sampleParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  sampleParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  sampleParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  sampleParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  sampleParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
  sampleParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
  sampleParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  sampleParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  sampleParams.super_RenderParams.w.m_data[3] = *(float *)(sampleParams._140_8_ + 0x14);
  tcu::TestLog::operator<<(&local_3e8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_3e8,(char (*) [27])"Compare reference value = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,sampleParams.super_RenderParams.w.m_data + 3);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3e8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&pixelFormat.blueBits,pTVar4,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&pixelFormat.blueBits,(char (*) [22])"Texture coordinates: "
                     );
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(Vector<float,_2> *)(sampleParams._140_8_ + 4));
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [5])" -> ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(Vector<float,_2> *)(sampleParams._140_8_ + 0xc));
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&pixelFormat.blueBits);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)local_228,(Vec2 *)(sampleParams._140_8_ + 4),
             (Vec2 *)(sampleParams._140_8_ + 0xc));
  iVar2 = *(int *)sampleParams._140_8_;
  pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  util::TextureRenderer::renderQuad
            (&this->m_renderer,
             (Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,iVar2,pvVar8,
             (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4));
  texFormat = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  PVar10 = getPixelFormat(texFormat);
  pixelFormat._0_8_ = PVar10._8_8_;
  local_578 = PVar10._0_8_;
  tcu::LodPrecision::LodPrecision((LodPrecision *)&texComparePrecision.referenceBits,RULE_VULKAN);
  tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_5b0);
  texComparePrecision.resultBits = 0x12;
  tcu::Vector<int,_3>::Vector(&local_5bc,0x14,0x14,0);
  texComparePrecision.coordBits.m_data[0] = local_5bc.m_data[2];
  local_5b0._0_4_ = local_5bc.m_data[0];
  local_5b0._4_4_ = local_5bc.m_data[1];
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_5c8,7,7,0);
  texComparePrecision.uvwBits.m_data[0] = local_5c0;
  texComparePrecision.coordBits.m_data[1] = auStack_5c8._0_4_;
  texComparePrecision.coordBits.m_data[2] = stack0xfffffffffffffa3c;
  texComparePrecision.uvwBits.m_data[1] = 5;
  texComparePrecision.uvwBits.m_data[2] = 0x10;
  texComparePrecision.pcfBits = local_578._0_4_ + -1;
  pTVar3 = Context::getTestContext((this->super_TestInstance).m_context);
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&local_5f8,
             (Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  iVar2 = (*(pTVar6->super_TestTexture)._vptr_TestTexture[0x10])();
  pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  local_5c9 = verifyTexCompareResult<tcu::Texture2D>
                        (pTVar3,&local_5f8,(Texture2D *)CONCAT44(extraout_var_00,iVar2),pvVar8,
                         (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),
                         (TexComparePrecision *)local_5b0,
                         (LodPrecision *)&texComparePrecision.referenceBits,(PixelFormat *)local_578
                        );
  if (!(bool)local_5c9) {
    pTVar3 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_778,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_778,
                        (char (*) [66])
                        "Warning: Verification assuming high-quality PCF filtering failed.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_778);
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_784,4,4,0);
    texComparePrecision.uvwBits.m_data[0] = local_77c;
    texComparePrecision.coordBits.m_data[1] = auStack_784._0_4_;
    texComparePrecision.coordBits.m_data[2] = stack0xfffffffffffff880;
    texComparePrecision.uvwBits.m_data[1] = 0;
    pTVar3 = Context::getTestContext((this->super_TestInstance).m_context);
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&local_7b0,
               (Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    iVar2 = (*(pTVar6->super_TestTexture)._vptr_TestTexture[0x10])();
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_228,0);
    local_785 = verifyTexCompareResult<tcu::Texture2D>
                          (pTVar3,&local_7b0,(Texture2D *)CONCAT44(extraout_var_01,iVar2),pvVar8,
                           (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),
                           (TexComparePrecision *)local_5b0,
                           (LodPrecision *)&texComparePrecision.referenceBits,
                           (PixelFormat *)local_578);
    if (!(bool)local_785) {
      pTVar3 = Context::getTestContext((this->super_TestInstance).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_930,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_930,
                          (char (*) [82])
                          "ERROR: Verification against low precision requirements failed, failing test case."
                         );
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_930);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_950,"Image verification failed",&local_951);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_950);
      std::__cxx11::string::~string((string *)&local_950);
      std::allocator<char>::~allocator(&local_951);
      goto LAB_00ee1906;
    }
  }
  this->m_caseNdx = this->m_caseNdx + 1;
  iVar2 = this->m_caseNdx;
  sVar9 = std::
          vector<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
          ::size(&this->m_cases);
  if (iVar2 < (int)sVar9) {
    tcu::TestStatus::incomplete();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"Pass",&local_979);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_978);
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator(&local_979);
  }
LAB_00ee1906:
  local_958 = 1;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_228);
  tcu::Surface::~Surface
            ((Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection(&local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus Texture2DShadowTestInstance::iterate (void)
{
	tcu::TestLog&					log				= m_context.getTestContext().getLog();
	const pipeline::TestTexture2D&	texture			= m_renderer.get2DTexture(m_cases[m_caseNdx].textureIndex);
	const tcu::TextureFormat		texFmt			= texture.getTextureFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section			(log, string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));

	const FilterCase&				curCase			= m_cases[m_caseNdx];
	ReferenceParams					sampleParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered		(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	vector<float>					texCoord;

	// Setup params for reference.
	sampleParams.sampler			= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	sampleParams.sampler.compare	= m_testParameters.compareOp;
	sampleParams.samplerType		= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode			= LODMODE_EXACT;
	sampleParams.colorBias			= fmtInfo.lookupBias;
	sampleParams.colorScale			= fmtInfo.lookupScale;
	sampleParams.ref				= curCase.ref;

	log << TestLog::Message << "Compare reference value = " << sampleParams.ref << TestLog::EndMessage;

	// Compute texture coordinates.
	log << TestLog::Message << "Texture coordinates: " << curCase.minCoord << " -> " << curCase.maxCoord << TestLog::EndMessage;
	computeQuadTexCoord2D(texCoord, curCase.minCoord, curCase.maxCoord);

	m_renderer.renderQuad(rendered, curCase.textureIndex, &texCoord[0], sampleParams);

	{
		const tcu::PixelFormat		pixelFormat			= getPixelFormat(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		tcu::LodPrecision			lodPrecision		(tcu::LodPrecision::RULE_VULKAN);
		tcu::TexComparePrecision	texComparePrecision;

		lodPrecision.derivateBits			= 18;
		lodPrecision.lodBits				= 6;
		texComparePrecision.coordBits		= tcu::IVec3(20,20,0);
		texComparePrecision.uvwBits			= tcu::IVec3(7,7,0);
		texComparePrecision.pcfBits			= 5;
		texComparePrecision.referenceBits	= 16;
		texComparePrecision.resultBits		= pixelFormat.redBits-1;

		const bool isHighQuality = verifyTexCompareResult(m_context.getTestContext(), rendered.getAccess(), texture.getTexture(),
														  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

			lodPrecision.lodBits			= 4;
			texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
			texComparePrecision.pcfBits		= 0;

			const bool isOk = verifyTexCompareResult(m_context.getTestContext(), rendered.getAccess(), texture.getTexture(),
													 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				return tcu::TestStatus::fail("Image verification failed");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}